

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

void __thiscall spoa::SisdAlignmentEngine::Implementation::Implementation(Implementation *this)

{
  Implementation *this_local;
  
  memset(this,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->node_id_to_rank);
  memset(&this->sequence_profile,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&this->sequence_profile);
  memset(&this->M,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&this->M);
  this->H = (int32_t *)0x0;
  this->F = (int32_t *)0x0;
  this->E = (int32_t *)0x0;
  this->O = (int32_t *)0x0;
  this->Q = (int32_t *)0x0;
  return;
}

Assistant:

Implementation()
      : node_id_to_rank(),
        sequence_profile(),
        M(),
        H(nullptr),
        F(nullptr),
        E(nullptr),
        O(nullptr),
        Q(nullptr) {
  }